

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

void base64_decode(char *in,char *out)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  bool bVar4;
  char *local_58;
  char *local_50;
  long lStack_38;
  int errcode;
  unsigned_long blen;
  char *o;
  int local_20;
  int pos;
  int len;
  int i;
  char *out_local;
  char *in_local;
  
  _len = out;
  out_local = in;
  sVar2 = strlen(in);
  local_20 = (int)sVar2;
  o._4_4_ = 0;
  blen = (unsigned_long)_len;
  if (*out_local == '$') {
    blen = (unsigned_long)malloc((long)local_20);
  }
  for (pos = 0; pos < local_20; pos = pos + 4) {
    if (out_local[pos] == '$') {
      pos = pos + 2;
      while( true ) {
        bVar4 = false;
        if (out_local[pos + -1] != '$') {
          bVar4 = out_local[pos] != '\0';
        }
        if (!bVar4) break;
        pos = pos + 1;
      }
    }
    *(char *)(blen + (long)o._4_4_) =
         ""[(int)out_local[pos]] << 2 | ""[(int)out_local[pos + 1]] >> 4;
    *(char *)(blen + (long)(o._4_4_ + 1)) =
         ""[(int)out_local[pos + 1]] << 4 | ""[(int)out_local[pos + 2]] >> 2;
    *(char *)(blen + (long)(o._4_4_ + 2)) =
         ""[(int)out_local[pos + 2]] << 6 | ""[(int)out_local[pos + 3]];
    o._4_4_ = o._4_4_ + 3;
  }
  if (((out_local[pos + -2] == '=') || (out_local[pos + -2] == '\0')) &&
     ((out_local[pos + -1] == '=' || (out_local[pos + -1] == '\0')))) {
    o._4_4_ = o._4_4_ + -1;
  }
  if (((out_local[pos + -3] == '=') || (out_local[pos + -2] == '\0')) &&
     ((out_local[pos + -2] == '=' || (out_local[pos + -1] == '\0')))) {
    o._4_4_ = o._4_4_ + -1;
  }
  *(undefined1 *)(blen + (long)o._4_4_) = 0;
  if (*out_local == '$') {
    pos = pos + -4;
    iVar1 = base64_strlen(out_local);
    lStack_38 = (long)iVar1;
    iVar1 = uncompress(_len,&stack0xffffffffffffffc8,blen,(long)o._4_4_);
    free((void *)blen);
    if (iVar1 != 0) {
      lVar3 = ftell((FILE *)loginfo.flog);
      if (iVar1 == -4) {
        local_50 = "Out of memory";
      }
      else {
        if (iVar1 == -5) {
          local_58 = "Invalid size";
        }
        else {
          local_58 = "(unknown error)";
          if (iVar1 == -3) {
            local_58 = "Corrupted file";
          }
        }
        local_50 = local_58;
      }
      raw_printf("Decompressing save file failed at %ld: %s",lVar3,local_50);
      terminate();
    }
  }
  return;
}

Assistant:

static void base64_decode(const char *in, char *out)
{
    int i, len = strlen(in), pos = 0;
    char *o = out;

    if (*in == '$')
	o = malloc(len);

    for (i = 0; i < len; i += 4) {
	/* skip data between $ signs, it's the header for compressed data */
	if (in[i] == '$') {
	    for (i += 2; in[i-1] != '$' && in[i]; i++)
		/* empty */;
	}

	/* decode blocks; padding '=' are converted to 0 in the decoding table */
	o[pos  ] =   b64d[(int)in[i  ]] << 2          | b64d[(int)in[i+1]] >> 4;
	o[pos+1] =   b64d[(int)in[i+1]] << 4          | b64d[(int)in[i+2]] >> 2;
	o[pos+2] = ((b64d[(int)in[i+2]] << 6) & 0xc0) | b64d[(int)in[i+3]];
	pos += 3;
    }

    i -= 4;
    if ((in[i+2] == '=' || !in[i+2]) && (in[i+3] == '=' || !in[i+3])) pos--;
    if ((in[i+1] == '=' || !in[i+2]) && (in[i+2] == '=' || !in[i+3])) pos--;

    o[pos] = 0;

    if (*in == '$') {
	unsigned long blen = base64_strlen(in);
	int errcode = uncompress((unsigned char *)out, &blen,
				 (unsigned char *)o, pos);
	free(o);
	if (errcode != Z_OK) {
	    raw_printf("Decompressing save file failed at %ld: %s",
		       ftell(loginfo.flog),
		       errcode == Z_MEM_ERROR ? "Out of memory" :
		       errcode == Z_BUF_ERROR ? "Invalid size" :
		       errcode == Z_DATA_ERROR ? "Corrupted file" :
		       "(unknown error)");
	    terminate();
	}
    }
}